

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::optimizeMemoryCopy(OptimizeInstructions *this,MemoryCopy *memCopy)

{
  Expression *pEVar1;
  Expression *pEVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  OptimizeInstructions *pOVar6;
  Const *pCVar7;
  Module *pMVar8;
  Load *pLVar9;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  Type local_170;
  size_t local_168;
  char *local_160;
  Type local_158;
  Address local_150;
  Address local_148;
  size_t local_140;
  char *local_138;
  Type local_130;
  size_t local_128;
  char *local_120;
  Type local_118;
  Address local_110;
  Address local_108;
  size_t local_100;
  char *local_f8;
  Type local_f0;
  size_t local_e8;
  char *local_e0;
  Type local_d8;
  Address local_d0;
  Address local_c8 [2];
  optional<wasm::Type> local_b8;
  Drop *local_a8;
  Drop *local_a0;
  initializer_list<wasm::Expression_*> local_98;
  Builder local_88;
  Builder builder_1;
  int64_t bytes;
  Const *csize;
  optional<wasm::Type> local_68;
  Drop *local_58;
  Drop *local_50;
  Drop *local_48;
  initializer_list<wasm::Expression_*> local_40;
  Builder local_30;
  Builder builder;
  PassOptions *options;
  MemoryCopy *memCopy_local;
  OptimizeInstructions *this_local;
  
  builder.wasm = (Module *)Pass::getPassOptions((Pass *)this);
  if (((((ulong)((builder.wasm)->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish & 1) != 0) ||
      (((ulong)((builder.wasm)->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish & 0x100) != 0)) &&
     (bVar3 = areConsecutiveInputsEqual(this,memCopy->dest,memCopy->source), bVar3)) {
    pMVar8 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .
                        super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      );
    Builder::Builder(&local_30,pMVar8);
    local_58 = Builder::makeDrop(&local_30,memCopy->dest);
    local_50 = Builder::makeDrop(&local_30,memCopy->source);
    local_48 = Builder::makeDrop(&local_30,memCopy->size);
    local_40._M_array = (iterator)&local_58;
    local_40._M_len = 3;
    std::optional<wasm::Type>::optional(&local_68);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_68.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_68.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    pOVar6 = (OptimizeInstructions *)Builder::makeBlock(&local_30,&local_40,type);
    return (Expression *)pOVar6;
  }
  pCVar7 = Expression::dynCast<wasm::Const>(memCopy->size);
  if (pCVar7 != (Const *)0x0) {
    builder_1.wasm = (Module *)wasm::Literal::getInteger(&pCVar7->value);
    pMVar8 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .
                        super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      );
    Builder::Builder(&local_88,pMVar8);
    uVar4 = (uint)builder_1.wasm;
    switch(builder_1.wasm) {
    case (Module *)0x0:
      if ((((ulong)((builder.wasm)->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish & 1) != 0) ||
         (((ulong)((builder.wasm)->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish & 0x100) != 0)) {
        local_a8 = Builder::makeDrop(&local_88,memCopy->dest);
        local_a0 = Builder::makeDrop(&local_88,memCopy->source);
        local_98._M_array = (iterator)&local_a8;
        local_98._M_len = 2;
        std::optional<wasm::Type>::optional(&local_b8);
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_7_ = 0;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             local_b8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_payload;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged =
             local_b8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_engaged;
        pOVar6 = (OptimizeInstructions *)Builder::makeBlock(&local_88,&local_98,type_00);
        return (Expression *)pOVar6;
      }
      break;
    case (Module *)0x1:
    case (Module *)0x2:
    case (Module *)0x4:
      wasm::Address::Address(local_c8,0);
      pEVar1 = memCopy->dest;
      uVar5 = (uint)builder_1.wasm;
      wasm::Address::Address(&local_d0,0);
      pEVar2 = memCopy->source;
      wasm::Type::Type(&local_d8,i32);
      local_e8 = (memCopy->sourceMemory).super_IString.str._M_len;
      local_e0 = (memCopy->sourceMemory).super_IString.str._M_str;
      pLVar9 = Builder::makeLoad(&local_88,uVar5,false,local_d0,1,pEVar2,local_d8,
                                 (Name)(memCopy->sourceMemory).super_IString.str);
      wasm::Type::Type(&local_f0,i32);
      local_100 = (memCopy->destMemory).super_IString.str._M_len;
      local_f8 = (memCopy->destMemory).super_IString.str._M_str;
      pOVar6 = (OptimizeInstructions *)
               Builder::makeStore(&local_88,uVar4,local_c8[0],1,pEVar1,(Expression *)pLVar9,local_f0
                                  ,(Name)(memCopy->destMemory).super_IString.str);
      return (Expression *)pOVar6;
    default:
      break;
    case (Module *)0x8:
      wasm::Address::Address(&local_108,0);
      pEVar1 = memCopy->dest;
      uVar5 = (uint)builder_1.wasm;
      wasm::Address::Address(&local_110,0);
      pEVar2 = memCopy->source;
      wasm::Type::Type(&local_118,i64);
      local_128 = (memCopy->sourceMemory).super_IString.str._M_len;
      local_120 = (memCopy->sourceMemory).super_IString.str._M_str;
      pLVar9 = Builder::makeLoad(&local_88,uVar5,false,local_110,1,pEVar2,local_118,
                                 (Name)(memCopy->sourceMemory).super_IString.str);
      wasm::Type::Type(&local_130,i64);
      local_140 = (memCopy->destMemory).super_IString.str._M_len;
      local_138 = (memCopy->destMemory).super_IString.str._M_str;
      pOVar6 = (OptimizeInstructions *)
               Builder::makeStore(&local_88,uVar4,local_108,1,pEVar1,(Expression *)pLVar9,local_130,
                                  (Name)(memCopy->destMemory).super_IString.str);
      return (Expression *)pOVar6;
    case (Module *)0x10:
      if (*(int *)&((builder.wasm)->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish == 0) {
        pMVar8 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 ::getModule(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                              ).
                              super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              .
                              super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            );
        bVar3 = FeatureSet::hasSIMD(&pMVar8->features);
        if (bVar3) {
          uVar4 = (uint)builder_1.wasm;
          wasm::Address::Address(&local_148,0);
          pEVar1 = memCopy->dest;
          uVar5 = (uint)builder_1.wasm;
          wasm::Address::Address(&local_150,0);
          pEVar2 = memCopy->source;
          wasm::Type::Type(&local_158,v128);
          local_168 = (memCopy->sourceMemory).super_IString.str._M_len;
          local_160 = (memCopy->sourceMemory).super_IString.str._M_str;
          pLVar9 = Builder::makeLoad(&local_88,uVar5,false,local_150,1,pEVar2,local_158,
                                     (Name)(memCopy->sourceMemory).super_IString.str);
          wasm::Type::Type(&local_170,v128);
          pOVar6 = (OptimizeInstructions *)
                   Builder::makeStore(&local_88,uVar4,local_148,1,pEVar1,(Expression *)pLVar9,
                                      local_170,(Name)(memCopy->destMemory).super_IString.str);
          return (Expression *)pOVar6;
        }
      }
    }
  }
  return (Expression *)(OptimizeInstructions *)0x0;
}

Assistant:

Expression* optimizeMemoryCopy(MemoryCopy* memCopy) {
    auto& options = getPassOptions();

    if (options.ignoreImplicitTraps || options.trapsNeverHappen) {
      if (areConsecutiveInputsEqual(memCopy->dest, memCopy->source)) {
        // memory.copy(x, x, sz)  ==>  {drop(x), drop(x), drop(sz)}
        Builder builder(*getModule());
        return builder.makeBlock({builder.makeDrop(memCopy->dest),
                                  builder.makeDrop(memCopy->source),
                                  builder.makeDrop(memCopy->size)});
      }
    }

    // memory.copy(dst, src, C)  ==>  store(dst, load(src))
    if (auto* csize = memCopy->size->dynCast<Const>()) {
      auto bytes = csize->value.getInteger();
      Builder builder(*getModule());

      switch (bytes) {
        case 0: {
          if (options.ignoreImplicitTraps || options.trapsNeverHappen) {
            // memory.copy(dst, src, 0)  ==>  {drop(dst), drop(src)}
            return builder.makeBlock({builder.makeDrop(memCopy->dest),
                                      builder.makeDrop(memCopy->source)});
          }
          break;
        }
        case 1:
        case 2:
        case 4: {
          return builder.makeStore(bytes, // bytes
                                   0,     // offset
                                   1,     // align
                                   memCopy->dest,
                                   builder.makeLoad(bytes,
                                                    false,
                                                    0,
                                                    1,
                                                    memCopy->source,
                                                    Type::i32,
                                                    memCopy->sourceMemory),
                                   Type::i32,
                                   memCopy->destMemory);
        }
        case 8: {
          return builder.makeStore(bytes, // bytes
                                   0,     // offset
                                   1,     // align
                                   memCopy->dest,
                                   builder.makeLoad(bytes,
                                                    false,
                                                    0,
                                                    1,
                                                    memCopy->source,
                                                    Type::i64,
                                                    memCopy->sourceMemory),
                                   Type::i64,
                                   memCopy->destMemory);
        }
        case 16: {
          if (options.shrinkLevel == 0) {
            // This adds an extra 2 bytes so apply it only for
            // minimal shrink level
            if (getModule()->features.hasSIMD()) {
              return builder.makeStore(bytes, // bytes
                                       0,     // offset
                                       1,     // align
                                       memCopy->dest,
                                       builder.makeLoad(bytes,
                                                        false,
                                                        0,
                                                        1,
                                                        memCopy->source,
                                                        Type::v128,
                                                        memCopy->sourceMemory),
                                       Type::v128,
                                       memCopy->destMemory);
            }
          }
          break;
        }
        default: {
        }
      }
    }
    return nullptr;
  }